

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *other;
  Message *pMVar3;
  Message *sub_message_copy;
  byte local_81;
  LogMessage local_80;
  FieldDescriptor *local_48;
  FieldDescriptor *field_local;
  Message *sub_message_local;
  Message *message_local;
  Reflection *this_local;
  Arena *local_20;
  FieldDescriptor *local_18;
  Arena *local_10;
  
  local_81 = 0;
  local_48 = field;
  field_local = (FieldDescriptor *)sub_message;
  sub_message_local = message;
  message_local = (Message *)this;
  if ((sub_message != (Message *)0x0) &&
     (pAVar1 = MessageLite::GetOwningArena(&sub_message->super_MessageLite), pAVar1 != (Arena *)0x0)
     ) {
    pAVar1 = MessageLite::GetOwningArena((MessageLite *)field_local);
    pAVar2 = MessageLite::GetArenaForAllocation(&sub_message_local->super_MessageLite);
    if (pAVar1 != pAVar2) {
      internal::LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x7f9);
      local_81 = 1;
      other = internal::LogMessage::operator<<
                        (&local_80,
                         "CHECK failed: sub_message == nullptr || sub_message->GetOwningArena() == nullptr || sub_message->GetOwningArena() == message->GetArenaForAllocation(): "
                        );
      internal::LogFinisher::operator=((LogFinisher *)((long)&sub_message_copy + 3),other);
    }
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  anon_unknown_0::CheckInvalidAccess(&this->schema_,local_48);
  if (field_local != (FieldDescriptor *)0x0) {
    pAVar1 = MessageLite::GetOwningArena((MessageLite *)field_local);
    pAVar2 = MessageLite::GetArenaForAllocation(&sub_message_local->super_MessageLite);
    if (pAVar1 != pAVar2) {
      pAVar1 = MessageLite::GetOwningArena((MessageLite *)field_local);
      if ((pAVar1 == (Arena *)0x0) &&
         (pAVar1 = MessageLite::GetArenaForAllocation(&sub_message_local->super_MessageLite),
         pAVar1 != (Arena *)0x0)) {
        local_20 = MessageLite::GetArenaForAllocation(&sub_message_local->super_MessageLite);
        this_local = (Reflection *)field_local;
        local_18 = field_local;
        local_10 = local_20;
        if (field_local != (FieldDescriptor *)0x0) {
          internal::ThreadSafeArena::AddCleanup
                    ((ThreadSafeArena *)local_20,field_local,
                     internal::arena_delete_object<google::protobuf::MessageLite>);
        }
        UnsafeArenaSetAllocatedMessage(this,sub_message_local,(Message *)field_local,local_48);
        return;
      }
      pMVar3 = MutableMessage(this,sub_message_local,local_48,(MessageFactory *)0x0);
      (*(pMVar3->super_MessageLite)._vptr_MessageLite[0xd])(pMVar3,field_local);
      return;
    }
  }
  UnsafeArenaSetAllocatedMessage(this,sub_message_local,(Message *)field_local,local_48);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  GOOGLE_DCHECK(sub_message == nullptr || sub_message->GetOwningArena() == nullptr ||
         sub_message->GetOwningArena() == message->GetArenaForAllocation());
  CheckInvalidAccess(schema_, field);

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != nullptr &&
      sub_message->GetOwningArena() != message->GetArenaForAllocation()) {
    if (sub_message->GetOwningArena() == nullptr &&
        message->GetArenaForAllocation() != nullptr) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArenaForAllocation()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}